

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O3

bool __thiscall DHUDMessageFadeInOut::Tick(DHUDMessageFadeInOut *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = DHUDMessageFadeOut::Tick(&this->super_DHUDMessageFadeOut);
  if (((!bVar3) && ((this->super_DHUDMessageFadeOut).super_DHUDMessage.State == 0)) &&
     (iVar1 = (this->super_DHUDMessageFadeOut).super_DHUDMessage.Tics,
     iVar2 = *(int *)&(this->super_DHUDMessageFadeOut).field_0xc4, iVar2 <= iVar1)) {
    (this->super_DHUDMessageFadeOut).super_DHUDMessage.State = 1;
    (this->super_DHUDMessageFadeOut).super_DHUDMessage.Tics = iVar1 - iVar2;
  }
  return bVar3;
}

Assistant:

bool DHUDMessageFadeInOut::Tick ()
{
	if (!Super::Tick ())
	{
		if (State == 0 && FadeInTics <= Tics)
		{
			State++;
			Tics -= FadeInTics;
		}
		return false;
	}
	return true;
}